

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Bullet(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 pos;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 col;
  float fVar4;
  float fVar5;
  ImRect bb;
  ImRect local_28;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    fVar4 = (pIVar1->DC).CurrLineSize.y;
    local_28.Max.x = pIVar2->FontSize;
    fVar5 = (pIVar2->Style).FramePadding.y;
    fVar5 = fVar5 + fVar5 + local_28.Max.x;
    if (fVar5 <= fVar4) {
      fVar4 = fVar5;
    }
    fVar4 = (float)(~-(uint)(local_28.Max.x <= fVar4) & (uint)local_28.Max.x |
                   (uint)fVar4 & -(uint)(local_28.Max.x <= fVar4));
    local_28.Min.x = (pIVar1->DC).CursorPos.x;
    local_28.Min.y = (pIVar1->DC).CursorPos.y;
    local_28.Max.x = local_28.Max.x + local_28.Min.x;
    local_28.Max.y = fVar4 + local_28.Min.y;
    ItemSize(&local_28,-1.0);
    bVar3 = ItemAdd(&local_28,0,(ImRect *)0x0);
    if (bVar3) {
      col = GetColorU32(0,1.0);
      pos.y = local_28.Min.y + fVar4 * 0.5;
      pos.x = local_28.Min.x + pIVar2->FontSize * 0.5 + (pIVar2->Style).FramePadding.x;
      RenderBullet(pIVar1->DrawList,pos,col);
    }
    fVar4 = (pIVar2->Style).FramePadding.x;
    SameLine(0.0,fVar4 + fVar4);
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}